

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool cmQtAutoGenerator::FileRead(string *content,string *filename,string *error)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  unsigned_long uVar3;
  char *pcVar4;
  anon_class_32_4_69c5485e local_258;
  ifstream local_238 [8];
  ifstream ifs;
  unsigned_long length;
  string *error_local;
  string *filename_local;
  string *content_local;
  
  std::__cxx11::string::clear();
  bVar1 = cmsys::SystemTools::FileExists(filename,true);
  if (bVar1) {
    uVar3 = cmsys::SystemTools::FileLength(filename);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var2 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(local_238,pcVar4,_Var2);
    local_258.ifs = local_238;
    local_258.length = uVar3;
    local_258.content = content;
    local_258.error = error;
    content_local._7_1_ = FileRead::anon_class_32_4_69c5485e::operator()(&local_258);
    std::ifstream::~ifstream(local_238);
  }
  else {
    if (error != (string *)0x0) {
      std::__cxx11::string::operator=((string *)error,"Not a file.");
    }
    content_local._7_1_ = false;
  }
  return content_local._7_1_;
}

Assistant:

bool cmQtAutoGenerator::FileRead(std::string& content,
                                 std::string const& filename,
                                 std::string* error)
{
  content.clear();
  if (!cmSystemTools::FileExists(filename, true)) {
    if (error != nullptr) {
      *error = "Not a file.";
    }
    return false;
  }

  unsigned long const length = cmSystemTools::FileLength(filename);
  cmsys::ifstream ifs(filename.c_str(), (std::ios::in | std::ios::binary));

  // Use lambda to save destructor calls of ifs
  return [&ifs, length, &content, error]() -> bool {
    if (!ifs) {
      if (error != nullptr) {
        *error = "Opening the file for reading failed.";
      }
      return false;
    }
    content.reserve(length);
    typedef std::istreambuf_iterator<char> IsIt;
    content.assign(IsIt{ ifs }, IsIt{});
    if (!ifs) {
      content.clear();
      if (error != nullptr) {
        *error = "Reading from the file failed.";
      }
      return false;
    }
    return true;
  }();
}